

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O1

int parseconfig(char *filename,GlobalConfig *global)

{
  OperationConfig *pOVar1;
  GlobalConfig *pGVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  CURLcode CVar6;
  ParameterError res;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  byte *flag;
  size_t sVar9;
  byte *pbVar10;
  byte *pbVar11;
  OperationConfig *config;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  _Bool usedarg;
  dynbuf buf;
  _Bool local_1089;
  FILE *local_1088;
  OperationConfig *local_1080;
  int local_1078;
  uint local_1074;
  char *local_1070;
  GlobalConfig *local_1068;
  char *local_1060;
  dynbuf local_1058;
  char local_1038 [4104];
  
  local_1089 = false;
  local_1080 = global->last;
  pcVar7 = filename;
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    pcVar12 = homedir(".curlrc");
    bVar17 = true;
    if (pcVar12 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)curl_maprintf("%s%s.curlrc",pcVar12,"/");
      pcVar15 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        bVar17 = false;
        pcVar7 = filename;
        pcVar15 = (char *)0x0;
      }
    }
    free(pcVar12);
    if (!bVar17) {
      return 1;
    }
  }
  else {
    pcVar15 = (char *)0x0;
  }
  if (pcVar7 == (char *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    iVar5 = strcmp(pcVar7,"-");
    __stream = _stdin;
    if (iVar5 != 0) {
      __stream = fopen64(pcVar7,"r");
    }
  }
  if (__stream == (FILE *)0x0) {
    iVar5 = 1;
  }
  else {
    local_1070 = pcVar7;
    local_1068 = global;
    curlx_dyn_init(&local_1058,0x19000);
    local_1078 = 0;
    local_1074 = 0;
    local_1088 = __stream;
    local_1060 = pcVar15;
LAB_00119f65:
    do {
      pcVar7 = fgets(local_1038,0x1000,__stream);
      if (pcVar7 == (char *)0x0) {
        sVar8 = curlx_dyn_len(&local_1058);
        bVar17 = sVar8 != 0;
        bVar16 = false;
      }
      else {
        CVar6 = curlx_dyn_add(&local_1058,local_1038);
        bVar16 = CVar6 != CURLE_OK;
        if ((!bVar16) && (pcVar7 = strchr(local_1038,10), pcVar7 == (char *)0x0)) goto LAB_00119f65;
        bVar17 = CVar6 == CURLE_OK;
      }
      if (!bVar17) break;
      local_1074 = local_1074 + 1;
      flag = (byte *)curlx_dyn_ptr(&local_1058);
      bVar17 = true;
      if (flag == (byte *)0x0) {
        local_1078 = 1;
      }
      else {
        bVar3 = *flag;
        while ((bVar3 != 0 && (iVar5 = Curl_isspace((uint)bVar3), iVar5 != 0))) {
          bVar3 = flag[1];
          flag = flag + 1;
        }
        bVar3 = *flag;
        if ((0x2f < (ulong)bVar3) ||
           (__stream = local_1088, (0x840800002401U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          bVar4 = *flag;
          for (pbVar13 = flag;
              ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 == 0)) &&
              ((bVar3 == 0x2d || ((*pbVar13 != 0x3a && (*pbVar13 != 0x3d))))));
              pbVar13 = pbVar13 + 1) {
            bVar4 = pbVar13[1];
          }
          if (*pbVar13 != 0) {
            *pbVar13 = 0;
            pbVar13 = pbVar13 + 1;
          }
          bVar4 = *pbVar13;
          for (; (bVar4 != 0 &&
                 ((iVar5 = Curl_isspace((uint)bVar4), iVar5 != 0 ||
                  ((bVar3 != 0x2d && ((*pbVar13 == 0x3d || (*pbVar13 == 0x3a))))))));
              pbVar13 = pbVar13 + 1) {
            bVar4 = pbVar13[1];
          }
          bVar3 = *pbVar13;
          if (bVar3 == 0x22) {
            sVar9 = strlen((char *)(pbVar13 + 1));
            pbVar10 = (byte *)malloc(sVar9 + 1);
            pbVar11 = pbVar10;
            pbVar13 = pbVar13 + 1;
            if (pbVar10 == (byte *)0x0) {
              local_1078 = 1;
              bVar17 = true;
              __stream = local_1088;
              goto LAB_0011a02d;
            }
LAB_0011a0de:
            while( true ) {
              pbVar14 = pbVar13;
              bVar4 = *pbVar14;
              if (bVar4 == 0x5c) {
                bVar4 = pbVar14[1];
                switch(bVar4) {
                case 0x6e:
                  bVar4 = 10;
                  break;
                case 0x6f:
                case 0x70:
                case 0x71:
                case 0x73:
                case 0x75:
                  break;
                case 0x72:
                  bVar4 = 0xd;
                  break;
                case 0x74:
                  bVar4 = 9;
                  break;
                case 0x76:
                  bVar4 = 0xb;
                  break;
                default:
                  goto switchD_0011a11f_default;
                }
                goto switchD_0011a11f_caseD_6f;
              }
              if ((bVar4 == 0) || (bVar4 == 0x22)) break;
              *pbVar11 = bVar4;
              pbVar11 = pbVar11 + 1;
              pbVar13 = pbVar14 + 1;
            }
            *pbVar11 = 0;
          }
          else {
            bVar4 = *pbVar13;
            pbVar10 = pbVar13;
            while ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 == 0))) {
              bVar4 = pbVar10[1];
              pbVar10 = pbVar10 + 1;
            }
            if (*pbVar10 != 0) {
              *pbVar10 = 0;
              do {
                pbVar10 = pbVar10 + 1;
                if (*pbVar10 == 0) break;
                iVar5 = Curl_isspace((uint)*pbVar10);
              } while (iVar5 != 0);
              if ((0x23 < (ulong)*pbVar10) || ((0x800002401U >> ((ulong)*pbVar10 & 0x3f) & 1) == 0))
              {
                warnf(local_1080->global,
                      "%s:%d: warning: \'%s\' uses unquoted whitespace in the line that may cause side-effects!\n"
                      ,local_1070,(ulong)local_1074,flag);
              }
            }
            pbVar10 = (byte *)0x0;
            if (*pbVar13 != 0) {
              pbVar10 = pbVar13;
            }
          }
          pGVar2 = local_1068;
          res = getparameter((char *)flag,(char *)pbVar10,&local_1089,local_1068,local_1080);
          local_1080 = pGVar2->last;
          if ((pbVar10 != (byte *)0x0) && (res == PARAM_OK)) {
            if (*pbVar10 == 0) {
              res = PARAM_OK;
            }
            else {
              res = (local_1089 ^ 1) * 9;
            }
          }
          if (res == PARAM_NEXT_OPERATION) {
            res = PARAM_NEXT_OPERATION;
            if ((local_1080->url_list != (getout *)0x0) &&
               (local_1080->url_list->url != (char *)0x0)) {
              config = (OperationConfig *)malloc(0x538);
              pOVar1 = local_1080;
              local_1080->next = config;
              if (config == (OperationConfig *)0x0) {
                res = PARAM_NO_MEM;
              }
              else {
                config_init(config);
                local_1080 = pOVar1->next;
                local_1080->global = local_1068;
                local_1068->last = local_1080;
                local_1080->prev = pOVar1;
              }
            }
          }
          pcVar7 = local_1070;
          if ((res != PARAM_OK) && (res != PARAM_NEXT_OPERATION)) {
            iVar5 = strcmp(local_1070,"-");
            if (iVar5 == 0) {
              pcVar7 = "<stdin>";
            }
            local_1070 = pcVar7;
            if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
              pcVar12 = param2text(res);
              warnf(local_1080->global,"%s:%d: warning: \'%s\' %s\n",pcVar7,(ulong)local_1074,flag,
                    pcVar12);
            }
          }
          pcVar15 = local_1060;
          __stream = local_1088;
          if (bVar3 == 0x22) {
            free(pbVar10);
          }
        }
        curlx_dyn_reset(&local_1058);
        bVar17 = false;
      }
LAB_0011a02d:
    } while (!bVar17);
    curlx_dyn_free(&local_1058);
    if (__stream != _stdin) {
      fclose(__stream);
    }
    iVar5 = local_1078;
    if (bVar16) {
      iVar5 = 1;
    }
  }
  curl_free(pcVar15);
  return iVar5;
switchD_0011a11f_default:
  pbVar13 = pbVar14 + 1;
  if (bVar4 != 0) {
switchD_0011a11f_caseD_6f:
    *pbVar11 = bVar4;
    pbVar11 = pbVar11 + 1;
    pbVar13 = pbVar14 + 2;
  }
  goto LAB_0011a0de;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file = NULL;
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->last;
  char *pathalloc = NULL;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

    char *home = homedir(".curlrc");
#ifndef WIN32
    if(home) {
      pathalloc = curl_maprintf("%s%s.curlrc", home, DIR_CHAR);
      if(!pathalloc) {
        free(home);
        return 1; /* out of memory */
      }
      filename = pathalloc;
    }
#else /* Windows */
    if(home) {
      int i = 0;
      char prefix = '.';
      do {
        /* if it was allocated in a previous attempt */
        curl_free(pathalloc);
        /* check for .curlrc then _curlrc in the home dir */
        pathalloc = curl_maprintf("%s%s%ccurlrc", home, DIR_CHAR, prefix);
        if(!pathalloc) {
          free(home);
          return 1; /* out of memory */
        }

        /* Check if the file exists - if not, try _curlrc */
        file = fopen(pathalloc, FOPEN_READTEXT);
        if(file) {
          filename = pathalloc;
          break;
        }
        prefix = '_';
      } while(++i < 2);
    }
    if(!filename) {
      /* check for .curlrc then _curlrc in the dir of the executable */
      file = execpath(".curlrc");
      if(!file)
        file = execpath("_curlrc");
    }
#endif

    Curl_safefree(home); /* we've used it, now free it */
  }

  if(!file && filename) { /* no need to fopen() again */
    if(strcmp(filename, "-"))
      file = fopen(filename, FOPEN_READTEXT);
    else
      file = stdin;
  }

  if(file) {
    char *line;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;
    struct curlx_dynbuf buf;
    bool fileerror;
    curlx_dyn_init(&buf, MAX_CONFIG_LINE_LENGTH);

    while(my_get_line(file, &buf, &fileerror)) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = curlx_dyn_ptr(&buf);
      if(!line) {
        rc = 1; /* out of memory */
        break;
      }

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        curlx_dyn_reset(&buf);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* null-terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* null-terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "whitespace in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);
      operation = global->last;

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      curlx_dyn_reset(&buf);
    }
    curlx_dyn_free(&buf);
    if(file != stdin)
      fclose(file);
    if(fileerror)
      rc = 1;
  }
  else
    rc = 1; /* couldn't open the file */

  curl_free(pathalloc);
  return rc;
}